

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::processFunctions(TranslateToFuzzReader *this)

{
  value_type pFVar1;
  Module *pMVar2;
  Expression *right;
  Name target;
  bool bVar3;
  Index IVar4;
  Index IVar5;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *pvVar6;
  size_type sVar7;
  reference ppFVar8;
  size_type sVar9;
  reference ppFVar10;
  pointer pEVar11;
  Name *pNVar12;
  value_type *pvVar13;
  Call *left;
  Block *pBVar14;
  reference this_00;
  pointer pFVar15;
  Name NVar16;
  optional<wasm::Type> type;
  bool local_1e2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_6;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  undefined1 local_180 [12];
  Type local_170;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_168;
  size_t local_148;
  char *pcStack_140;
  Call *local_130;
  Call *call;
  char *pcStack_120;
  Importable *local_110;
  Function *func_5;
  value_type *exp;
  Index i;
  BasicType local_ec;
  Type local_e8;
  reference local_e0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_4;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range1_2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> noParamsOrResultFuncs;
  Function *func_3;
  Function *func_2;
  Index index;
  Index chance;
  int RESOLUTION;
  Function *func_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range1_1;
  size_type numInitialExports;
  reference local_48;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range1;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> moddable;
  TranslateToFuzzReader *this_local;
  
  moddable.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
            ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1);
  pvVar6 = &this->wasm->functions;
  __end1 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(pvVar6);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(pvVar6);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                     *)&func), bVar3) {
    local_48 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end1);
    pFVar15 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                        (local_48);
    bVar3 = Importable::imported(&pFVar15->super_Importable);
    if (!bVar3) {
      numInitialExports =
           (size_type)
           std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(local_48);
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1,
                 (value_type *)&numInitialExports);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end1);
  }
  sVar7 = std::
          vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ::size(&this->wasm->exports);
  __end1_1 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin
                       ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1);
  func_1 = (Function *)
           std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end
                     ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                             *)&func_1), bVar3) {
    ppFVar8 = __gnu_cxx::
              __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator*(&__end1_1);
    addInvocations(this,*ppFVar8);
    __gnu_cxx::
    __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
    ::operator++(&__end1_1);
  }
  IVar4 = upTo(this,0xb);
  while (bVar3 = Random::finished(&this->random), ((bVar3 ^ 0xffU) & 1) != 0) {
    bVar3 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::empty
                      ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1);
    if ((bVar3) || (IVar5 = upTo(this,10), IVar4 <= IVar5)) {
      noParamsOrResultFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)addFunction(this);
      addInvocations(this,(Function *)
                          noParamsOrResultFuncs.
                          super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if ((this->allowOOB & 1U) != 0) {
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                  ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1,
                   (value_type *)
                   &noParamsOrResultFuncs.
                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      sVar9 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size
                        ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1);
      IVar5 = upTo(this,(Index)sVar9);
      ppFVar10 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[]
                           ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1
                            ,(ulong)IVar5);
      modFunction(this,*ppFVar10);
      ppFVar10 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::back
                           ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1
                           );
      pFVar1 = *ppFVar10;
      ppFVar10 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[]
                           ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1
                            ,(ulong)IVar5);
      *ppFVar10 = pFVar1;
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::pop_back
                ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1);
    }
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_2);
  pvVar6 = &this->wasm->functions;
  __end1_2 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(pvVar6);
  func_4 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end(pvVar6);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                             *)&func_4), bVar3) {
    local_e0 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end1_2);
    pFVar15 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                        (local_e0);
    local_e8 = Function::getParams(pFVar15);
    local_ec = none;
    bVar3 = Type::operator==(&local_e8,&local_ec);
    local_1e2 = false;
    if (bVar3) {
      pFVar15 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                          (local_e0);
      _i = Function::getResults(pFVar15);
      exp._4_4_ = 0;
      local_1e2 = Type::operator==((Type *)&i,(BasicType *)((long)&exp + 4));
    }
    if (local_1e2 != false) {
      pFVar15 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                          (local_e0);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_2,
                 (value_type *)pFVar15);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end1_2);
  }
  bVar3 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::empty
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_2);
  if (!bVar3) {
    for (exp._0_4_ = 0; (uint)exp < sVar7; exp._0_4_ = (uint)exp + 1) {
      func_5 = (Function *)
               std::
               vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ::operator[](&this->wasm->exports,(ulong)(uint)exp);
      pEVar11 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                          ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)func_5);
      if ((pEVar11->kind == Function) && (IVar5 = upTo(this,10), IVar5 < IVar4)) {
        pMVar2 = this->wasm;
        pEVar11 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                            ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)func_5)
        ;
        pNVar12 = Export::getInternalName(pEVar11);
        call = (Call *)(pNVar12->super_IString).str._M_len;
        pcStack_120 = (pNVar12->super_IString).str._M_str;
        NVar16.super_IString.str._M_str = (char *)call;
        NVar16.super_IString.str._M_len = (size_t)pMVar2;
        local_110 = (Importable *)::wasm::Module::getFunction(NVar16);
        bVar3 = Importable::imported(local_110);
        if (!bVar3) {
          pvVar13 = pick<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                              (this,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_2);
          local_148 = (pvVar13->super_IString).str._M_len;
          pcStack_140 = (pvVar13->super_IString).str._M_str;
          local_168.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_168.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_168.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_168);
          Type::Type(&local_170,none);
          target.super_IString.str._M_str = pcStack_140;
          target.super_IString.str._M_len = local_148;
          left = Builder::makeCall(&this->builder,target,&local_168,local_170,false);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_168);
          right = (Expression *)local_110[1].base.super_IString.str._M_len;
          local_130 = left;
          std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_180);
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._12_4_ = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)local_180._0_8_;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_180[8];
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_3_ = local_180._9_3_;
          pBVar14 = Builder::makeSequence(&this->builder,(Expression *)left,right,type);
          local_110[1].base.super_IString.str._M_len = (size_t)pBVar14;
        }
      }
    }
  }
  if (0 < (this->fuzzParams->super_FuzzParams).HANG_LIMIT) {
    pvVar6 = &this->wasm->functions;
    __end2 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(pvVar6);
    func_6 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
             std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::end(pvVar6);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                       *)&func_6), bVar3) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                ::operator*(&__end2);
      pFVar15 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                          (this_00);
      bVar3 = Importable::imported(&pFVar15->super_Importable);
      if (!bVar3) {
        pFVar15 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                            (this_00);
        addHangLimitChecks(this,pFVar15);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_2);
  std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~vector
            ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&__range1);
  return;
}

Assistant:

void TranslateToFuzzReader::processFunctions() {
  // Functions that are eligible for being modded. We only do so once to each
  // function, at most, so once we do we remove it from here.
  std::vector<Function*> moddable;

  // Defined initial functions are moddable.
  for (auto& func : wasm.functions) {
    if (!func->imported()) {
      moddable.push_back(func.get());
    }
  }

  auto numInitialExports = wasm.exports.size();

  // Add invocations, which can help execute the code here even if the function
  // was not exported (or was exported but with a signature that traps
  // immediately, like receiving a non-nullable ref, that the fuzzer can't
  // provide from JS). Note we cannot iterate on wasm.functions because
  // addInvocations modifies that.
  for (auto* func : moddable) {
    addInvocations(func);
  }

  // We do not want to always mod in the same frequency. Pick a chance to mod a
  // function. When the chance is maximal we will mod every single function, and
  // immediately after creating it; when the chance is minimal we will not mod
  // anything; values in the middle will end up randomly modding some functions,
  // at random times (random times are useful because we might create function
  // A, then B, then mod A, and since B has already been created, the modding of
  // A may lead to calls to B).
  const int RESOLUTION = 10;
  auto chance = upTo(RESOLUTION + 1);

  // Keep working while we have random data.
  while (!random.finished()) {
    if (!moddable.empty() && upTo(RESOLUTION) < chance) {
      // Mod an existing function.
      auto index = upTo(moddable.size());
      auto* func = moddable[index];
      modFunction(func);

      // Remove this function from the vector by swapping the last item to its
      // place, and truncating.
      moddable[index] = moddable.back();
      moddable.pop_back();
    } else {
      // Add a new function
      auto* func = addFunction();
      addInvocations(func);

      // It may be modded later, if we allow out-of-bounds: we emit OOB checks
      // in the code we just generated, and any changes could break that.
      if (allowOOB) {
        moddable.push_back(func);
      }
    }
  }

  // Interpose on initial exports. When initial content contains exports, it can
  // be useful to add new code that executes in them, rather than just adding
  // new exports later. To some extent modifying the initially-exported function
  // gives us that, but typically these are small changes, not calls to entirely
  // new code (and this is especially important when preserveImportsAndExports,
  // as in that mode we do not add new exports, so this interposing is our main
  // chance to run new code using the existing exports).
  //
  // Interpose with a call before the old code. We do a call here so that we end
  // up running a useful amount of new code (rather than just make(none) which
  // would only emit something local in the current function, and which depends
  // on its contents).
  // TODO: We could also interpose after, either in functions without results,
  //       or by saving the results to a temp local as we call.
  //
  // Specifically, we will call functions, for simplicity, with no params or
  // results. Such functions exist in abundance in general, because the
  // invocations we add look exactly that way. First, find all such functions,
  // and then find places to interpose calls to them.
  std::vector<Name> noParamsOrResultFuncs;
  for (auto& func : wasm.functions) {
    if (func->getParams() == Type::none && func->getResults() == Type::none) {
      noParamsOrResultFuncs.push_back(func->name);
    }
  }
  if (!noParamsOrResultFuncs.empty()) {
    for (Index i = 0; i < numInitialExports; i++) {
      auto& exp = wasm.exports[i];
      if (exp->kind == ExternalKind::Function && upTo(RESOLUTION) < chance) {
        auto* func = wasm.getFunction(*exp->getInternalName());
        if (!func->imported()) {
          auto* call =
            builder.makeCall(pick(noParamsOrResultFuncs), {}, Type::none);
          func->body = builder.makeSequence(call, func->body);
        }
      }
    }
  }

  // At the very end, add hang limit checks (so no modding can override them).
  if (fuzzParams->HANG_LIMIT > 0) {
    for (auto& func : wasm.functions) {
      if (!func->imported()) {
        addHangLimitChecks(func.get());
      }
    }
  }
}